

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

char * Io_MvParseTableBlif(Io_MvMod_t *p,char *pTable,int nFanins)

{
  char cVar1;
  Vec_Ptr_t *vTokens_00;
  Vec_Str_t *p_00;
  Io_MvMan_t *pIVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  bool local_92;
  bool local_91;
  Io_MvMod_t *local_68;
  uint local_54;
  int local_50;
  int Polarity;
  int i;
  char c;
  char *pOutput;
  char *pProduct;
  Vec_Str_t *vFunc;
  Vec_Ptr_t *vTokens;
  int nFanins_local;
  char *pTable_local;
  Io_MvMod_t *p_local;
  
  vTokens_00 = p->pMan->vTokens;
  p_00 = p->pMan->vFunc;
  local_54 = 0xffffffff;
  p->pMan->nTablesRead = p->pMan->nTablesRead + 1;
  Io_MvSplitIntoTokens(vTokens_00,pTable,'.');
  iVar3 = Vec_PtrSize(vTokens_00);
  if (iVar3 == 0) {
    p_local = (Io_MvMod_t *)Abc_SopCreateConst0((Mem_Flex_t *)p->pNtk->pManFunc);
  }
  else {
    iVar3 = Vec_PtrSize(vTokens_00);
    if (iVar3 == 1) {
      pcVar6 = (char *)Vec_PtrEntry(vTokens_00,0);
      cVar1 = *pcVar6;
      if ((((cVar1 == '0') || (cVar1 == '1')) || ((cVar1 == 'x' || (cVar1 == 'n')))) &&
         (pcVar6[1] == '\0')) {
        if (*pcVar6 == '0') {
          local_68 = (Io_MvMod_t *)Abc_SopCreateConst0((Mem_Flex_t *)p->pNtk->pManFunc);
        }
        else {
          local_68 = (Io_MvMod_t *)Abc_SopCreateConst1((Mem_Flex_t *)p->pNtk->pManFunc);
        }
        p_local = local_68;
      }
      else {
        pIVar2 = p->pMan;
        uVar4 = Io_MvGetLine(p->pMan,pcVar6);
        sprintf(pIVar2->sError,"Line %d: Constant table has wrong output value \"%s\".",(ulong)uVar4
                ,pcVar6);
        p_local = (Io_MvMod_t *)0x0;
      }
    }
    else {
      pcVar6 = (char *)Vec_PtrEntry(vTokens_00,0);
      iVar3 = Vec_PtrSize(vTokens_00);
      if (iVar3 % 2 == 1) {
        pIVar2 = p->pMan;
        uVar4 = Io_MvGetLine(p->pMan,pcVar6);
        uVar5 = Vec_PtrSize(vTokens_00);
        sprintf(pIVar2->sError,"Line %d: Table has odd number of tokens (%d).",(ulong)uVar4,
                (ulong)uVar5);
        p_local = (Io_MvMod_t *)0x0;
      }
      else {
        Vec_StrClear(p_00);
        for (local_50 = 0; iVar3 = Vec_PtrSize(vTokens_00), local_50 < iVar3 / 2;
            local_50 = local_50 + 1) {
          pcVar6 = (char *)Vec_PtrEntry(vTokens_00,local_50 << 1);
          pcVar7 = (char *)Vec_PtrEntry(vTokens_00,local_50 * 2 + 1);
          sVar8 = strlen(pcVar6);
          if (sVar8 != (uint)nFanins) {
            pIVar2 = p->pMan;
            uVar4 = Io_MvGetLine(p->pMan,pcVar6);
            sprintf(pIVar2->sError,
                    "Line %d: Cube \"%s\" has size different from the fanin count (%d).",
                    (ulong)uVar4,pcVar6,(ulong)(uint)nFanins);
            return (char *)0x0;
          }
          cVar1 = *pcVar7;
          if (((((cVar1 != '0') && (cVar1 != '1')) && (cVar1 != 'x')) && (cVar1 != 'n')) ||
             (pcVar7[1] != '\0')) {
            pIVar2 = p->pMan;
            uVar4 = Io_MvGetLine(p->pMan,pcVar6);
            sprintf(pIVar2->sError,"Line %d: Output value \"%s\" is incorrect.",(ulong)uVar4,pcVar7)
            ;
            return (char *)0x0;
          }
          if (local_54 == 0xffffffff) {
            local_91 = cVar1 == '1' || cVar1 == 'x';
            local_54 = (uint)local_91;
          }
          else {
            local_92 = cVar1 == '1' || cVar1 == 'x';
            if (local_54 != local_92) {
              pIVar2 = p->pMan;
              uVar4 = Io_MvGetLine(p->pMan,pcVar6);
              sprintf(pIVar2->sError,
                      "Line %d: Output value \"%s\" differs from the value in the first line of the table (%d)."
                      ,(ulong)uVar4,pcVar7,(ulong)local_54);
              return (char *)0x0;
            }
          }
          Vec_StrPrintStr(p_00,pcVar6);
          Vec_StrPush(p_00,' ');
          Vec_StrPush(p_00,*pcVar7);
          Vec_StrPush(p_00,'\n');
        }
        Vec_StrPush(p_00,'\0');
        p_local = (Io_MvMod_t *)Vec_StrArray(p_00);
      }
    }
  }
  return (char *)p_local;
}

Assistant:

static char * Io_MvParseTableBlif( Io_MvMod_t * p, char * pTable, int nFanins )
{
    Vec_Ptr_t * vTokens = p->pMan->vTokens;
    Vec_Str_t * vFunc = p->pMan->vFunc;
    char * pProduct, * pOutput, c;
    int i, Polarity = -1;

    p->pMan->nTablesRead++;
    // get the tokens
    Io_MvSplitIntoTokens( vTokens, pTable, '.' );
    if ( Vec_PtrSize(vTokens) == 0 )
        return Abc_SopCreateConst0( (Mem_Flex_t *)p->pNtk->pManFunc );
    if ( Vec_PtrSize(vTokens) == 1 )
    {
        pOutput = (char *)Vec_PtrEntry( vTokens, 0 );
        c = pOutput[0];
        if ( (c!='0'&&c!='1'&&c!='x'&&c!='n') || pOutput[1] )
        {
            sprintf( p->pMan->sError, "Line %d: Constant table has wrong output value \"%s\".", Io_MvGetLine(p->pMan, pOutput), pOutput );
            return NULL;
        }
        return pOutput[0] == '0' ? Abc_SopCreateConst0((Mem_Flex_t *)p->pNtk->pManFunc) : Abc_SopCreateConst1((Mem_Flex_t *)p->pNtk->pManFunc);
    }
    pProduct = (char *)Vec_PtrEntry( vTokens, 0 );
    if ( Vec_PtrSize(vTokens) % 2 == 1 )
    {
        sprintf( p->pMan->sError, "Line %d: Table has odd number of tokens (%d).", Io_MvGetLine(p->pMan, pProduct), Vec_PtrSize(vTokens) );
        return NULL;
    }
    // parse the table
    Vec_StrClear( vFunc );
    for ( i = 0; i < Vec_PtrSize(vTokens)/2; i++ )
    {
        pProduct = (char *)Vec_PtrEntry( vTokens, 2*i + 0 );
        pOutput  = (char *)Vec_PtrEntry( vTokens, 2*i + 1 );
        if ( strlen(pProduct) != (unsigned)nFanins )
        {
            sprintf( p->pMan->sError, "Line %d: Cube \"%s\" has size different from the fanin count (%d).", Io_MvGetLine(p->pMan, pProduct), pProduct, nFanins );
            return NULL;
        }
        c = pOutput[0];
        if ( (c!='0'&&c!='1'&&c!='x'&&c!='n') || pOutput[1] )
        {
            sprintf( p->pMan->sError, "Line %d: Output value \"%s\" is incorrect.", Io_MvGetLine(p->pMan, pProduct), pOutput );
            return NULL;
        }
        if ( Polarity == -1 )
            Polarity = (c=='1' || c=='x');
        else if ( Polarity != (c=='1' || c=='x') )
        {
            sprintf( p->pMan->sError, "Line %d: Output value \"%s\" differs from the value in the first line of the table (%d).", Io_MvGetLine(p->pMan, pProduct), pOutput, Polarity );
            return NULL;
        }
        // parse one product 
        Vec_StrPrintStr( vFunc, pProduct );
        Vec_StrPush( vFunc, ' ' );
        Vec_StrPush( vFunc, pOutput[0] );
        Vec_StrPush( vFunc, '\n' );
    }
    Vec_StrPush( vFunc, '\0' );
    return Vec_StrArray( vFunc );
}